

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O2

int secp256k1_ecdsa_adaptor_sign
              (secp256k1_context *ctx,uchar *adaptor_sig65,uchar *adaptor_proof97,uchar *seckey32,
              secp256k1_pubkey *adaptor,uchar *msg32)

{
  int iVar1;
  undefined4 extraout_EAX;
  undefined4 extraout_EAX_00;
  void *pvVar2;
  char *pcVar3;
  secp256k1_ecmult_gen_context *ctx_00;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  secp256k1_ge *in_stack_fffffffffffff8f8;
  secp256k1_scalar local_6e8;
  uchar nonce32 [32];
  uchar nonce32_1 [32];
  secp256k1_scalar dleq_proof_e;
  secp256k1_scalar dleq_proof_s;
  secp256k1_scalar local_648;
  secp256k1_ge adaptor_ge;
  int overflow;
  secp256k1_gej r1j;
  uchar buf32 [32];
  uchar key32 [32];
  secp256k1_ge r;
  uchar buf33 [33];
  secp256k1_scalar sp;
  secp256k1_ge p2;
  secp256k1_sha256 local_348;
  secp256k1_gej rpj;
  secp256k1_gej rj;
  secp256k1_scalar msg;
  secp256k1_ge rp;
  secp256k1_ge r2;
  secp256k1_ge r1;
  
  if ((ctx->ecmult_gen_ctx).prec == (secp256k1_ge_storage (*) [64] [16])0x0) {
    pvVar2 = (ctx->illegal_callback).data;
    pcVar3 = "secp256k1_ecmult_gen_context_is_built(&ctx->ecmult_gen_ctx)";
  }
  else if (adaptor_sig65 == (uchar *)0x0) {
    pvVar2 = (ctx->illegal_callback).data;
    pcVar3 = "adaptor_sig65 != NULL";
  }
  else if (adaptor_proof97 == (uchar *)0x0) {
    pvVar2 = (ctx->illegal_callback).data;
    pcVar3 = "adaptor_proof97 != NULL";
  }
  else if (adaptor == (secp256k1_pubkey *)0x0) {
    pvVar2 = (ctx->illegal_callback).data;
    pcVar3 = "adaptor != NULL";
  }
  else {
    if (msg32 != (uchar *)0x0) {
      local_348.s[0] = 0x6a09e667;
      local_348.s[1] = 0xbb67ae85;
      local_348.s[2] = 0x3c6ef372;
      local_348.s[3] = 0xa54ff53a;
      local_348.s[4] = 0x510e527f;
      local_348.s[5] = 0x9b05688c;
      local_348.s[6] = 0x1f83d9ab;
      local_348.s[7] = 0x5be0cd19;
      local_348.bytes = 0;
      secp256k1_sha256_write(&local_348,msg32,0x20);
      iVar1 = secp256k1_pubkey_load(ctx,&adaptor_ge,adaptor);
      if (iVar1 == 0) {
        return 0;
      }
      secp256k1_dleq_serialize_point(buf33,&adaptor_ge);
      secp256k1_sha256_write(&local_348,buf33,0x21);
      secp256k1_sha256_finalize(&local_348,buf33);
      iVar1 = nonce_function_dleq(nonce32,buf33,seckey32,(uchar *)"ECDSAAdaptorNon");
      if (iVar1 == 0) {
        return 0;
      }
      secp256k1_scalar_set_b32(&local_6e8,nonce32,(int *)0x0);
      auVar4._0_4_ = -(uint)((int)local_6e8.d[2] == 0 && (int)local_6e8.d[0] == 0);
      auVar4._4_4_ = -(uint)(local_6e8.d[2]._4_4_ == 0 && local_6e8.d[0]._4_4_ == 0);
      auVar4._8_4_ = -(uint)((int)local_6e8.d[3] == 0 && (int)local_6e8.d[1] == 0);
      auVar4._12_4_ = -(uint)(local_6e8.d[3]._4_4_ == 0 && local_6e8.d[1]._4_4_ == 0);
      iVar1 = movmskps(extraout_EAX,auVar4);
      if (iVar1 == 0xf) {
        return 0;
      }
      ctx_00 = &ctx->ecmult_gen_ctx;
      secp256k1_ecmult_gen(ctx_00,&rpj,&local_6e8);
      secp256k1_ecmult_const(&rj,&adaptor_ge,&local_6e8,0x100);
      secp256k1_ecmult_gen(ctx_00,(secp256k1_gej *)&r,&local_6e8);
      secp256k1_ge_set_gej((secp256k1_ge *)&overflow,(secp256k1_gej *)&r);
      secp256k1_ecmult_const((secp256k1_gej *)&rp,&adaptor_ge,&local_6e8,0x100);
      secp256k1_ge_set_gej(&p2,(secp256k1_gej *)&rp);
      sp.d[0] = 0xbb67ae856a09e667;
      sp.d[1] = 0xa54ff53a3c6ef372;
      sp.d[2] = 0x9b05688c510e527f;
      sp.d[3] = 0x5be0cd191f83d9ab;
      secp256k1_dleq_hash_point((secp256k1_sha256 *)&sp,&adaptor_ge);
      secp256k1_dleq_hash_point((secp256k1_sha256 *)&sp,(secp256k1_ge *)&overflow);
      secp256k1_dleq_hash_point((secp256k1_sha256 *)&sp,&p2);
      secp256k1_sha256_finalize((secp256k1_sha256 *)&sp,buf32);
      secp256k1_scalar_get_b32(key32,&local_6e8);
      iVar1 = nonce_function_dleq(nonce32_1,buf32,key32,(uchar *)"ECDSAAdaptorSig");
      if (iVar1 == 0) {
        return 0;
      }
      secp256k1_scalar_set_b32(&local_648,nonce32_1,(int *)0x0);
      auVar5._0_4_ = -(uint)((int)local_648.d[2] == 0 && (int)local_648.d[0] == 0);
      auVar5._4_4_ = -(uint)(local_648.d[2]._4_4_ == 0 && local_648.d[0]._4_4_ == 0);
      auVar5._8_4_ = -(uint)((int)local_648.d[3] == 0 && (int)local_648.d[1] == 0);
      auVar5._12_4_ = -(uint)(local_648.d[3]._4_4_ == 0 && local_648.d[1]._4_4_ == 0);
      iVar1 = movmskps(extraout_EAX_00,auVar5);
      if (iVar1 == 0xf) {
        return 0;
      }
      secp256k1_ecmult_gen(ctx_00,&r1j,&local_648);
      secp256k1_ge_set_gej(&r1,&r1j);
      secp256k1_ecmult_const((secp256k1_gej *)&msg,&adaptor_ge,&local_648,0x100);
      secp256k1_ge_set_gej(&r2,(secp256k1_gej *)&msg);
      secp256k1_dleq_challenge_hash
                (&dleq_proof_e,(uchar *)&adaptor_ge,&r1,&r2,(secp256k1_ge *)&overflow,&p2,
                 in_stack_fffffffffffff8f8);
      secp256k1_scalar_mul(&dleq_proof_s,&dleq_proof_e,&local_6e8);
      secp256k1_scalar_add(&dleq_proof_s,&dleq_proof_s,&local_648);
      secp256k1_ge_set_gej(&r,&rj);
      secp256k1_scalar_set_b32((secp256k1_scalar *)&r1j,seckey32,&overflow);
      if (overflow != 0) {
        return 0;
      }
      if ((r1j.x.n[3] == 0 && r1j.x.n[1] == 0) && (r1j.x.n[2] == 0 && r1j.x.n[0] == 0)) {
        return 0;
      }
      secp256k1_scalar_set_b32(&msg,msg32,(int *)0x0);
      iVar1 = secp256k1_ecdsa_adaptor_sign_helper(&sp,&msg,&local_6e8,&r,(secp256k1_scalar *)&r1j);
      if (iVar1 != 0) {
        secp256k1_ge_set_gej(&rp,&rpj);
        secp256k1_dleq_serialize_point(adaptor_proof97,&rp);
        secp256k1_scalar_get_b32(adaptor_proof97 + 0x21,&dleq_proof_s);
        secp256k1_scalar_get_b32(adaptor_proof97 + 0x41,&dleq_proof_e);
        secp256k1_dleq_serialize_point(adaptor_sig65,&r);
        secp256k1_scalar_get_b32(adaptor_sig65 + 0x21,&sp);
        return 1;
      }
      return 0;
    }
    pvVar2 = (ctx->illegal_callback).data;
    pcVar3 = "msg32 != NULL";
  }
  (*(ctx->illegal_callback).fn)(pcVar3,pvVar2);
  return 0;
}

Assistant:

int secp256k1_ecdsa_adaptor_sign(const secp256k1_context* ctx, unsigned char *adaptor_sig65, unsigned char *adaptor_proof97, unsigned char *seckey32, const secp256k1_pubkey *adaptor, const unsigned char *msg32) {
    unsigned char nonce32[32];
    unsigned char buf33[33];
    secp256k1_sha256 sha;
    secp256k1_scalar k;
    secp256k1_gej rj, rpj;
    secp256k1_ge r, rp;
    secp256k1_ge adaptor_ge;
    secp256k1_scalar dleq_proof_s;
    secp256k1_scalar dleq_proof_e;
    secp256k1_scalar sk;
    secp256k1_scalar msg;
    secp256k1_scalar sp;
    int overflow;

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(secp256k1_ecmult_gen_context_is_built(&ctx->ecmult_gen_ctx));
    ARG_CHECK(adaptor_sig65 != NULL);
    ARG_CHECK(adaptor_proof97 != NULL);
    ARG_CHECK(adaptor != NULL);
    ARG_CHECK(msg32 != NULL);

    /* 1. Choose k randomly, R' = k*G */
    /* Include msg32 and adaptor in nonce derivation */
    secp256k1_sha256_initialize(&sha);
    secp256k1_sha256_write(&sha, msg32, 32);
    if (!secp256k1_pubkey_load(ctx, &adaptor_ge, adaptor)) {
        return 0;
    }
    secp256k1_dleq_serialize_point(buf33, &adaptor_ge);
    secp256k1_sha256_write(&sha, buf33, 33);
    secp256k1_sha256_finalize(&sha, buf33);
    if (!nonce_function_dleq(nonce32, buf33, seckey32, (unsigned char *)"ECDSAAdaptorNon")) {
        return 0;
    }
    secp256k1_scalar_set_b32(&k, nonce32, NULL);
    if (secp256k1_scalar_is_zero(&k)) {
        return 0;
    }
    secp256k1_ecmult_gen(&ctx->ecmult_gen_ctx, &rpj, &k);

    /* 2. R = k*Y; */
    secp256k1_ecmult_const(&rj, &adaptor_ge, &k, 256);

    /* 4. [sic] proof = DLEQ_prove((G,R'),(Y, R)) */
    if (!secp256k1_dleq_proof(&ctx->ecmult_gen_ctx, &dleq_proof_s, &dleq_proof_e, (unsigned char *)"ECDSAAdaptorSig", &k, &adaptor_ge)) {
        return 0;
    }

    /* 5. s' = k⁻¹(H(m) + x_coord(R)x) */
    secp256k1_ge_set_gej(&r, &rj);
    secp256k1_scalar_set_b32(&sk, seckey32, &overflow);
    if (overflow || secp256k1_scalar_is_zero(&sk)) {
        return 0;
    }
    secp256k1_scalar_set_b32(&msg, msg32, NULL);
    if(!secp256k1_ecdsa_adaptor_sign_helper(&sp, &msg, &k, &r, &sk)) {
        secp256k1_scalar_clear(&k);
        secp256k1_scalar_clear(&sk);
        return 0;
    }

    /* 6. return (R, R', s', proof) */
    secp256k1_ge_set_gej(&rp, &rpj);
    secp256k1_ecdsa_adaptor_proof_serialize(adaptor_proof97, &rp, &dleq_proof_s, &dleq_proof_e);
    secp256k1_ecdsa_adaptor_sig_serialize(adaptor_sig65, &r, &sp);

    secp256k1_scalar_clear(&k);
    secp256k1_scalar_clear(&sk);
    return 1;
}